

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_siv.c
# Opt level: O0

int aes_siv_get_ctx_params(void *vctx,OSSL_PARAM *params)

{
  int iVar1;
  int iVar2;
  OSSL_PARAM *pOVar3;
  OSSL_PARAM *func;
  char *in_RDI;
  OSSL_PARAM *p;
  SIV128_CONTEXT *sctx;
  PROV_AES_SIV_CTX *ctx;
  OSSL_PARAM *in_stack_ffffffffffffffc8;
  int local_4;
  
  pOVar3 = (OSSL_PARAM *)(in_RDI + 0x18);
  func = OSSL_PARAM_locate(in_stack_ffffffffffffffc8,(char *)0x2f68a7);
  if (((func == (OSSL_PARAM *)0x0) || (func->data_type != 5)) ||
     (((in_RDI[4] & 1U) != 0 &&
      ((func->data_size == *(size_t *)(in_RDI + 0x10) &&
       (iVar1 = OSSL_PARAM_set_octet_string(pOVar3,func,(size_t)in_stack_ffffffffffffffc8),
       iVar1 != 0)))))) {
    iVar1 = (int)((ulong)pOVar3 >> 0x20);
    pOVar3 = OSSL_PARAM_locate(in_stack_ffffffffffffffc8,(char *)0x2f6960);
    if ((pOVar3 == (OSSL_PARAM *)0x0) ||
       (iVar2 = OSSL_PARAM_set_size_t(pOVar3,(size_t)in_stack_ffffffffffffffc8), iVar2 != 0)) {
      pOVar3 = OSSL_PARAM_locate(in_stack_ffffffffffffffc8,(char *)0x2f69d2);
      if ((pOVar3 == (OSSL_PARAM *)0x0) ||
         (iVar2 = OSSL_PARAM_set_size_t(pOVar3,(size_t)in_stack_ffffffffffffffc8), iVar2 != 0)) {
        local_4 = 1;
      }
      else {
        ERR_new();
        ERR_set_debug(in_RDI,iVar1,(char *)pOVar3);
        ERR_set_error(0x39,0x68,(char *)0x0);
        local_4 = 0;
      }
    }
    else {
      ERR_new();
      ERR_set_debug(in_RDI,iVar1,(char *)pOVar3);
      ERR_set_error(0x39,0x68,(char *)0x0);
      local_4 = 0;
    }
  }
  else {
    iVar1 = (int)((ulong)pOVar3 >> 0x20);
    ERR_new();
    ERR_set_debug(in_RDI,iVar1,(char *)func);
    ERR_set_error(0x39,0x68,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int aes_siv_get_ctx_params(void *vctx, OSSL_PARAM params[])
{
    PROV_AES_SIV_CTX *ctx = (PROV_AES_SIV_CTX *)vctx;
    SIV128_CONTEXT *sctx = &ctx->siv;
    OSSL_PARAM *p;

    p = OSSL_PARAM_locate(params, OSSL_CIPHER_PARAM_AEAD_TAG);
    if (p != NULL && p->data_type == OSSL_PARAM_OCTET_STRING) {
        if (!ctx->enc
            || p->data_size != ctx->taglen
            || !OSSL_PARAM_set_octet_string(p, &sctx->tag.byte, ctx->taglen)) {
            ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_SET_PARAMETER);
            return 0;
        }
    }
    p = OSSL_PARAM_locate(params, OSSL_CIPHER_PARAM_AEAD_TAGLEN);
    if (p != NULL && !OSSL_PARAM_set_size_t(p, ctx->taglen)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_SET_PARAMETER);
        return 0;
    }
    p = OSSL_PARAM_locate(params, OSSL_CIPHER_PARAM_KEYLEN);
    if (p != NULL && !OSSL_PARAM_set_size_t(p, ctx->keylen)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_SET_PARAMETER);
        return 0;
    }
    return 1;
}